

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O0

void Diligent::ValidateMapTextureParams
               (TextureDesc *TexDesc,Uint32 MipLevel,Uint32 ArraySlice,MAP_TYPE MapType,
               Uint32 MapFlags,Box *pMapRegion)

{
  bool bVar1;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  uint local_5c;
  char *local_58;
  uint local_4c;
  char *local_48;
  Box *local_40;
  Box *pMapRegion_local;
  Uint32 MapFlags_local;
  Uint32 UStack_2c;
  MAP_TYPE MapType_local;
  Uint32 ArraySlice_local;
  Uint32 MipLevel_local;
  TextureDesc *TexDesc_local;
  
  local_40 = pMapRegion;
  pMapRegion_local._0_4_ = MapFlags;
  pMapRegion_local._7_1_ = MapType;
  MapFlags_local = ArraySlice;
  UStack_2c = MipLevel;
  _ArraySlice_local = TexDesc;
  if (TexDesc->MipLevels <= MipLevel) {
    if ((TexDesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_70 = "";
    }
    else {
      local_70 = (TexDesc->super_DeviceObjectAttribs).Name;
    }
    local_48 = local_70;
    local_4c = TexDesc->MipLevels - 1;
    LogError<false,char[10],char_const*,char[4],char[12],unsigned_int,char[31],unsigned_int,char[3]>
              (false,"ValidateMapTextureParams",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1d3,(char (*) [10])0x4867c2,&local_48,(char (*) [4])"\': ",
               (char (*) [12])"Mip level (",&stack0xffffffffffffffd4,
               (char (*) [31])") is out of allowed range [0, ",&local_4c,(char (*) [3])0x45cb22);
  }
  bVar1 = TextureDesc::IsArray(_ArraySlice_local);
  if (bVar1) {
    if ((_ArraySlice_local->field_3).ArraySize <= MapFlags_local) {
      if ((_ArraySlice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_78 = "";
      }
      else {
        local_78 = (_ArraySlice_local->super_DeviceObjectAttribs).Name;
      }
      local_58 = local_78;
      local_5c = (_ArraySlice_local->field_3).ArraySize - 1;
      LogError<false,char[10],char_const*,char[4],char[14],unsigned_int,char[22],unsigned_int,char[3]>
                (false,"ValidateMapTextureParams",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x1d6,(char (*) [10])0x4867c2,&local_58,(char (*) [4])"\': ",
                 (char (*) [14])"Array slice (",&MapFlags_local,
                 (char (*) [22])") is out of range [0,",&local_5c,(char (*) [3])0x45cb22);
    }
  }
  else if (MapFlags_local != 0) {
    if ((_ArraySlice_local->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_80 = "";
    }
    else {
      local_80 = (_ArraySlice_local->super_DeviceObjectAttribs).Name;
    }
    local_68 = local_80;
    LogError<false,char[10],char_const*,char[4],char[14],unsigned_int,char[36]>
              (false,"ValidateMapTextureParams",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1da,(char (*) [10])0x4867c2,&local_68,(char (*) [4])"\': ",
               (char (*) [14])"Array slice (",&MapFlags_local,
               (char (*) [36])") must be 0 for non-array textures.");
  }
  if (local_40 != (Box *)0x0) {
    ValidateTextureRegion(_ArraySlice_local,UStack_2c,MapFlags_local,local_40);
  }
  return;
}

Assistant:

void ValidateMapTextureParams(const TextureDesc& TexDesc,
                              Uint32             MipLevel,
                              Uint32             ArraySlice,
                              MAP_TYPE           MapType,
                              Uint32             MapFlags,
                              const Box*         pMapRegion)
{
    VERIFY_TEX_PARAMS(MipLevel < TexDesc.MipLevels, "Mip level (", MipLevel, ") is out of allowed range [0, ", TexDesc.MipLevels - 1, "].");
    if (TexDesc.IsArray())
    {
        VERIFY_TEX_PARAMS(ArraySlice < TexDesc.ArraySize, "Array slice (", ArraySlice, ") is out of range [0,", TexDesc.ArraySize - 1, "].");
    }
    else
    {
        VERIFY_TEX_PARAMS(ArraySlice == 0, "Array slice (", ArraySlice, ") must be 0 for non-array textures.");
    }

    if (pMapRegion != nullptr)
    {
        ValidateTextureRegion(TexDesc, MipLevel, ArraySlice, *pMapRegion);
    }
}